

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

void __thiscall tf::Node::_precede(Node *this,Node *v)

{
  size_t sVar1;
  void *pvVar2;
  void *pvVar3;
  undefined8 uVar4;
  Node *local_20;
  Node *local_18;
  
  local_18 = v;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&this->_edges,&local_18);
  sVar1 = this->_num_successors;
  pvVar2 = (this->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  this->_num_successors = sVar1 + 1;
  pvVar3 = (this->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
  uVar4 = *(undefined8 *)((long)pvVar2 + sVar1 * 8);
  *(undefined8 *)((long)pvVar2 + sVar1 * 8) = *(undefined8 *)((long)pvVar3 + -8);
  *(undefined8 *)((long)pvVar3 + -8) = uVar4;
  local_20 = this;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_18->_edges,&local_20);
  return;
}

Assistant:

inline void Node::_precede(Node* v) {
  _edges.push_back(v);
  std::swap(_edges[_num_successors++], _edges[_edges.size() - 1]);
  v->_edges.push_back(this);
}